

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_rows(png_const_structrp png_ptr,png_inforp info_ptr,png_bytepp row_pointers)

{
  png_bytepp row_pointers_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    if ((info_ptr->row_pointers != (png_bytepp)0x0) && (info_ptr->row_pointers != row_pointers)) {
      png_free_data(png_ptr,info_ptr,0x40,0);
    }
    info_ptr->row_pointers = row_pointers;
    if (row_pointers != (png_bytepp)0x0) {
      info_ptr->valid = info_ptr->valid | 0x8000;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_rows(png_const_structrp png_ptr, png_inforp info_ptr,
    png_bytepp row_pointers)
{
   png_debug1(1, "in %s storage function", "rows");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (info_ptr->row_pointers != NULL &&
       (info_ptr->row_pointers != row_pointers))
      png_free_data(png_ptr, info_ptr, PNG_FREE_ROWS, 0);

   info_ptr->row_pointers = row_pointers;

   if (row_pointers != NULL)
      info_ptr->valid |= PNG_INFO_IDAT;
}